

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.h
# Opt level: O2

float * __thiscall FBX::Vector3::operator[](Vector3 *this,int index)

{
  runtime_error *this_00;
  
  if (index != 0) {
    if (index == 2) {
      this = (Vector3 *)&this->z;
    }
    else {
      if (index != 1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Access out of bounds");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this = (Vector3 *)&this->y;
    }
  }
  return &this->x;
}

Assistant:

float &operator[](int index) {
            if (index == 0)
                return x;
            else if (index == 1)
                return y;
            else if (index == 2)
                return z;
            else
                throw std::runtime_error("Access out of bounds");
        }